

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,string *internalDependsFileName,
          DependencyMap *validDeps)

{
  bool bVar1;
  bool bVar2;
  istream *piVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  string local_5b8;
  undefined1 local_598 [8];
  ostringstream msg_2;
  string local_420;
  undefined1 local_400 [8];
  ostringstream msg_1;
  string local_288;
  undefined1 local_268 [8];
  ostringstream msg;
  string local_e8 [6];
  bool dependeeExists;
  bool regenerate;
  mapped_type *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *currentDependencies;
  cmFileTime dependeeTime;
  cmFileTime dependerTime;
  string dependee;
  string depender;
  string local_60 [8];
  string line;
  bool dependerExists;
  bool okay;
  cmFileTime internalDependsTime;
  DependencyMap *validDeps_local;
  string *internalDependsFileName_local;
  istream *internalDepends_local;
  cmDepends *this_local;
  
  internalDependsTime.NS = (NSC)validDeps;
  cmFileTime::cmFileTime((cmFileTime *)&stack0xffffffffffffffc8);
  bVar1 = cmFileTimeCache::Load
                    (this->FileTimeCache,internalDependsFileName,
                     (cmFileTime *)&stack0xffffffffffffffc8);
  if (bVar1) {
    line.field_2._M_local_buf[0xf] = '\x01';
    line.field_2._M_local_buf[0xe] = '\0';
    std::__cxx11::string::string(local_60);
    std::__cxx11::string::reserve((ulong)local_60);
    std::__cxx11::string::string((string *)(dependee.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&dependerTime);
    cmFileTime::cmFileTime(&dependeeTime);
    cmFileTime::cmFileTime((cmFileTime *)&currentDependencies);
    local_c8 = (mapped_type *)0x0;
LAB_005658aa:
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (internalDepends,local_60);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (bVar1) {
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) && (pcVar5 = (char *)std::__cxx11::string::front(), *pcVar5 != '#')) {
        pcVar5 = (char *)std::__cxx11::string::back();
        if (*pcVar5 == '\r') {
          std::__cxx11::string::pop_back();
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) != 0) goto LAB_005658aa;
        }
        pcVar5 = (char *)std::__cxx11::string::front();
        if (*pcVar5 == ' ') {
          std::__cxx11::string::substr((ulong)local_e8,(ulong)local_60);
          std::__cxx11::string::operator=((string *)&dependerTime,local_e8);
          std::__cxx11::string::~string(local_e8);
          if (local_c8 !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_c8,(value_type *)&dependerTime);
          }
          bVar1 = false;
          bVar2 = cmFileTimeCache::Load
                            (this->FileTimeCache,(string *)&dependerTime,
                             (cmFileTime *)&currentDependencies);
          if (bVar2) {
            if ((line.field_2._M_local_buf[0xe] & 1U) == 0) {
              bVar2 = cmFileTime::Older((cmFileTime *)&stack0xffffffffffffffc8,
                                        (cmFileTime *)&currentDependencies);
              if ((bVar2) && (bVar1 = true, (this->Verbose & 1U) != 0)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
                poVar6 = std::operator<<((ostream *)local_598,"Dependee \"");
                poVar6 = std::operator<<(poVar6,(string *)&dependerTime);
                poVar6 = std::operator<<(poVar6,"\" is newer than depends file \"");
                poVar6 = std::operator<<(poVar6,(string *)internalDependsFileName);
                poVar6 = std::operator<<(poVar6,"\".");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                cmSystemTools::Stdout(&local_5b8);
                std::__cxx11::string::~string((string *)&local_5b8);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
              }
            }
            else {
              bVar2 = cmFileTime::Older(&dependeeTime,(cmFileTime *)&currentDependencies);
              if ((bVar2) && (bVar1 = true, (this->Verbose & 1U) != 0)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
                poVar6 = std::operator<<((ostream *)local_400,"Dependee \"");
                poVar6 = std::operator<<(poVar6,(string *)&dependerTime);
                poVar6 = std::operator<<(poVar6,"\" is newer than depender \"");
                poVar6 = std::operator<<(poVar6,(string *)(dependee.field_2._M_local_buf + 8));
                poVar6 = std::operator<<(poVar6,"\".");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                cmSystemTools::Stdout(&local_420);
                std::__cxx11::string::~string((string *)&local_420);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
              }
            }
          }
          else {
            bVar1 = true;
            if ((this->Verbose & 1U) != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
              poVar6 = std::operator<<((ostream *)local_268,"Dependee \"");
              poVar6 = std::operator<<(poVar6,(string *)&dependerTime);
              poVar6 = std::operator<<(poVar6,"\" does not exist for depender \"");
              poVar6 = std::operator<<(poVar6,(string *)(dependee.field_2._M_local_buf + 8));
              poVar6 = std::operator<<(poVar6,"\".");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              cmSystemTools::Stdout(&local_288);
              std::__cxx11::string::~string((string *)&local_288);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
            }
          }
          if (bVar1) {
            line.field_2._M_local_buf[0xf] = '\0';
            if (local_c8 != (mapped_type *)0x0) {
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)internalDependsTime.NS,(key_type *)((long)&dependee.field_2 + 8));
              local_c8 = (mapped_type *)0x0;
            }
            if ((line.field_2._M_local_buf[0xe] & 1U) != 0) {
              cmsys::SystemTools::RemoveFile((string *)((long)&dependee.field_2 + 8));
              cmFileTimeCache::Remove(this->FileTimeCache,(string *)((long)&dependee.field_2 + 8));
              line.field_2._M_local_buf[0xe] = '\0';
            }
          }
        }
        else {
          std::__cxx11::string::operator=((string *)(dependee.field_2._M_local_buf + 8),local_60);
          line.field_2._M_local_buf[0xe] =
               cmFileTimeCache::Load
                         (this->FileTimeCache,(string *)((long)&dependee.field_2 + 8),&dependeeTime)
          ;
          local_c8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                   *)internalDependsTime.NS,
                                  (key_type *)((long)&dependee.field_2 + 8));
        }
      }
      goto LAB_005658aa;
    }
    this_local._7_1_ = (bool)(line.field_2._M_local_buf[0xf] & 1);
    std::__cxx11::string::~string((string *)&dependerTime);
    std::__cxx11::string::~string((string *)(dependee.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_60);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmDepends::CheckDependencies(std::istream& internalDepends,
                                  const std::string& internalDependsFileName,
                                  DependencyMap& validDeps)
{
  // Read internal depends file time
  cmFileTime internalDependsTime;
  if (!this->FileTimeCache->Load(internalDependsFileName,
                                 internalDependsTime)) {
    return false;
  }

  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;

  std::string line;
  line.reserve(1024);
  std::string depender;
  std::string dependee;
  cmFileTime dependerTime;
  cmFileTime dependeeTime;
  std::vector<std::string>* currentDependencies = nullptr;

  while (std::getline(internalDepends, line)) {
    // Check if this an empty or a comment line
    if (line.empty() || line.front() == '#') {
      continue;
    }
    // Drop carriage return character at the end
    if (line.back() == '\r') {
      line.pop_back();
      if (line.empty()) {
        continue;
      }
    }
    // Check if this a depender line
    if (line.front() != ' ') {
      depender = line;
      dependerExists = this->FileTimeCache->Load(depender, dependerTime);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[depender];
      continue;
    }

    // This is a dependee line
    dependee = line.substr(1);

    // Add dependee to depender's list
    if (currentDependencies != nullptr) {
      currentDependencies->push_back(dependee);
    }

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    bool dependeeExists = this->FileTimeCache->Load(dependee, dependeeTime);
    if (!dependeeExists) {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if (this->Verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dependee << "\" does not exist for depender \""
            << depender << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
    } else if (dependerExists) {
      // The dependee and depender both exist.  Compare file times.
      if (dependerTime.Older(dependeeTime)) {
        // The depender is older than the dependee.
        regenerate = true;

        // Print verbose output.
        if (this->Verbose) {
          std::ostringstream msg;
          msg << "Dependee \"" << dependee << "\" is newer than depender \""
              << depender << "\"." << std::endl;
          cmSystemTools::Stdout(msg.str());
        }
      }
    } else {
      // The dependee exists, but the depender doesn't. Regenerate if the
      // internalDepends file is older than the dependee.
      if (internalDependsTime.Older(dependeeTime)) {
        // The depends-file is older than the dependee.
        regenerate = true;

        // Print verbose output.
        if (this->Verbose) {
          std::ostringstream msg;
          msg << "Dependee \"" << dependee
              << "\" is newer than depends file \"" << internalDependsFileName
              << "\"." << std::endl;
          cmSystemTools::Stdout(msg.str());
        }
      }
    }

    if (regenerate) {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != nullptr) {
        validDeps.erase(depender);
        currentDependencies = nullptr;
      }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists) {
        cmSystemTools::RemoveFile(depender);
        this->FileTimeCache->Remove(depender);
        dependerExists = false;
      }
    }
  }

  return okay;
}